

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

BigNumber *
montgomery(BigNumber *__return_storage_ptr__,BigNumber *a,BigNumber *b,BigNumber *n,int r,
          BigNumber *v)

{
  bool bVar1;
  BigNumber local_1d0;
  BigNumber local_1b0;
  BigNumber local_190;
  undefined1 local_169;
  BigNumber local_168;
  BigNumber local_148;
  BigNumber local_128;
  BigNumber local_108;
  undefined1 local_e8 [8];
  BigNumber m;
  BigNumber t;
  BigNumber local_98;
  BigNumber local_78;
  undefined1 local_58 [8];
  BigNumber s;
  BigNumber *v_local;
  int r_local;
  BigNumber *n_local;
  BigNumber *b_local;
  BigNumber *a_local;
  BigNumber *u;
  
  s.m_base = (unsigned_long)v;
  BigNumber::BigNumber(&local_78,a);
  BigNumber::BigNumber(&local_98,b);
  operator*((BigNumber *)local_58,&local_78,&local_98);
  BigNumber::~BigNumber(&local_98);
  BigNumber::~BigNumber(&local_78);
  partial_multiplication((BigNumber *)&m.m_base,(BigNumber *)local_58,(BigNumber *)s.m_base,r);
  BigNumber::m_mask((BigNumber *)&m.m_base,r);
  BigNumber::BigNumber(&local_108,(BigNumber *)local_58);
  BigNumber::BigNumber(&local_148,(BigNumber *)&m.m_base);
  BigNumber::BigNumber(&local_168,n);
  operator*(&local_128,&local_148,&local_168);
  operator+((BigNumber *)local_e8,&local_108,&local_128);
  BigNumber::~BigNumber(&local_128);
  BigNumber::~BigNumber(&local_168);
  BigNumber::~BigNumber(&local_148);
  BigNumber::~BigNumber(&local_108);
  local_169 = 0;
  BigNumber::BigNumber(__return_storage_ptr__,(BigNumber *)local_e8);
  BigNumber::operator<<(__return_storage_ptr__,r);
  bVar1 = operator>=(__return_storage_ptr__,n);
  if (bVar1) {
    BigNumber::BigNumber(&local_1b0,__return_storage_ptr__);
    BigNumber::BigNumber(&local_1d0,n);
    operator-(&local_190,&local_1b0,&local_1d0);
    BigNumber::operator=(__return_storage_ptr__,&local_190);
    BigNumber::~BigNumber(&local_190);
    BigNumber::~BigNumber(&local_1d0);
    BigNumber::~BigNumber(&local_1b0);
  }
  local_169 = 1;
  BigNumber::~BigNumber((BigNumber *)local_e8);
  BigNumber::~BigNumber((BigNumber *)&m.m_base);
  BigNumber::~BigNumber((BigNumber *)local_58);
  return __return_storage_ptr__;
}

Assistant:

BigNumber montgomery(BigNumber &a, BigNumber &b, BigNumber &n, int r, BigNumber &v){

//    clock_t t1, t2;
//    static clock_t t_tmp;
//    static unsigned int cmp = 0;
//    t1 = clock();

    BigNumber s = a*b;
    //BigNumber t = s*v;
    BigNumber t = partial_multiplication(s, v, r);
    t.m_mask(r);
    BigNumber m = s + t*n;
    BigNumber u = m;

    u << r;
    if(u >= n){
        u = u - n;
    }
//    t2 = clock();
//    t_tmp += (t2 - t1);
//    cmp += 1;
//    cout << " Montgomery : " << t_tmp/(float)cmp << endl;
    return u;

}